

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameDeleteAllNetworks(Abc_Frame_t *p)

{
  Abc_Ntk_t *local_30;
  Abc_Ntk_t *local_28;
  Abc_Ntk_t *local_20;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk;
  Abc_Frame_t *p_local;
  
  pNtk2 = p->pNtkCur;
  if (pNtk2 == (Abc_Ntk_t *)0x0) {
    local_28 = (Abc_Ntk_t *)0x0;
  }
  else {
    local_28 = Abc_NtkBackup(pNtk2);
  }
  local_20 = local_28;
  while (pNtk2 != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(pNtk2);
    pNtk2 = local_20;
    if (local_20 == (Abc_Ntk_t *)0x0) {
      local_30 = (Abc_Ntk_t *)0x0;
    }
    else {
      local_30 = Abc_NtkBackup(local_20);
    }
    local_20 = local_30;
  }
  p->pNtkCur = (Abc_Ntk_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeleteAllNetworks( Abc_Frame_t * p )
{
    Abc_Ntk_t * pNtk, * pNtk2;
    // delete all the currently saved networks
    for ( pNtk  = p->pNtkCur, 
          pNtk2 = pNtk? Abc_NtkBackup(pNtk): NULL; 
          pNtk; 
          pNtk  = pNtk2, 
          pNtk2 = pNtk? Abc_NtkBackup(pNtk): NULL )
        Abc_NtkDelete( pNtk );
    // set the current network empty
    p->pNtkCur = NULL;
//    fprintf( p->Out, "All networks have been deleted.\n" );
}